

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

String * __thiscall Time::toString(String *__return_storage_ptr__,Time *this,char *format)

{
  undefined4 uVar1;
  undefined4 uVar2;
  usize copyLength;
  ulong copyLength_00;
  Data *pDVar3;
  size_t sVar4;
  ulong minCapacity;
  tm local_58;
  
  if (*format == '\0') {
    __return_storage_ptr__->data = &String::emptyData.super_Data;
  }
  else {
    local_58.tm_sec = this->sec;
    local_58.tm_min = this->min;
    local_58.tm_hour = this->hour;
    local_58.tm_mday = this->day;
    uVar1 = this->month;
    uVar2 = this->year;
    local_58.tm_mon = uVar1 + -1;
    local_58.tm_year = uVar2 + -0x76c;
    local_58.tm_wday = this->wday;
    local_58.tm_yday = this->yday;
    local_58.tm_isdst = (int)this->dst;
    pDVar3 = (Data *)operator_new__(0x121);
    __return_storage_ptr__->data = pDVar3;
    pDVar3->str = (char *)(pDVar3 + 1);
    *(undefined1 *)&pDVar3[1].str = 0;
    pDVar3->len = 0;
    pDVar3->ref = 1;
    pDVar3->capacity = 0x100;
    while( true ) {
      copyLength = __return_storage_ptr__->data->len;
      String::detach(__return_storage_ptr__,copyLength,copyLength);
      pDVar3 = __return_storage_ptr__->data;
      if (pDVar3->ref == 1) {
        sVar4 = pDVar3->capacity;
      }
      else {
        sVar4 = 0;
      }
      sVar4 = strftime(pDVar3->str,sVar4,format,&local_58);
      if (sVar4 != 0) break;
      pDVar3 = __return_storage_ptr__->data;
      if (pDVar3->ref == 1) {
        minCapacity = pDVar3->capacity * 2;
      }
      else {
        minCapacity = 0;
      }
      copyLength_00 = pDVar3->len;
      if (minCapacity < copyLength_00) {
        minCapacity = copyLength_00;
      }
      String::detach(__return_storage_ptr__,copyLength_00,minCapacity);
    }
    String::detach(__return_storage_ptr__,sVar4,sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

String Time::toString(const char* format)
{
  if(!*format)
    return String();
  tm tm;
  tm.tm_sec = sec;
  tm.tm_min = min;
  tm.tm_hour = hour;
  tm.tm_mday = day;
  tm.tm_mon = month - 1;
  tm.tm_year = year - 1900;
  tm.tm_wday = wday;
  tm.tm_yday = yday;
  tm.tm_isdst = dst;

  String result(256);
  char* buffer;
  usize len;
  for(;;)
  {
    buffer = result;
    len = strftime(buffer, result.capacity(), format, &tm);
    if(len > 0)
      break;
    result.reserve(result.capacity() * 2);
  }
  result.resize(len);
  return result;
}